

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

void __thiscall
QObjectPrivate::ConnectionData::cleanOrphanedConnectionsImpl
          (ConnectionData *this,QObject *sender,LockPolicy lockPolicy)

{
  int iVar1;
  QBasicMutex *pQVar2;
  uintptr_t uVar3;
  int in_EDX;
  QObject *in_RSI;
  QBasicMutex *in_RDI;
  long in_FS_OFFSET;
  QBasicMutex *senderMutex;
  TaggedSignalVector c;
  unique_lock<QBasicMutex> lock;
  unique_lock<QBasicMutex> *in_stack_ffffffffffffff70;
  TaggedSignalVector in_stack_ffffffffffffff78;
  memory_order in_stack_ffffffffffffff8c;
  atomic<QObjectPrivate::TaggedSignalVector> *in_stack_ffffffffffffff90;
  TaggedSignalVector in_stack_ffffffffffffff98;
  TaggedSignalVector local_30;
  quintptr local_28;
  TaggedSignalVector local_20;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = signalSlotLock(in_RSI);
  local_20.c = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  TaggedSignalVector::TaggedSignalVector(&local_20,(nullptr_t)0x0);
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  std::unique_lock<QBasicMutex>::unique_lock((unique_lock<QBasicMutex> *)local_18,pQVar2);
  if (in_EDX == 0) {
    std::unique_lock<QBasicMutex>::lock(in_stack_ffffffffffffff70);
  }
  iVar1 = QBasicAtomicInteger<int>::loadAcquire((QBasicAtomicInteger<int> *)0x3eb1e7);
  if (iVar1 < 2) {
    in_stack_ffffffffffffff78.c = (quintptr)(in_RDI + 4);
    TaggedSignalVector::TaggedSignalVector(&local_30,(nullptr_t)0x0);
    local_28 = (quintptr)
               std::atomic<QObjectPrivate::TaggedSignalVector>::exchange
                         (in_stack_ffffffffffffff90,in_stack_ffffffffffffff98,
                          in_stack_ffffffffffffff8c);
    local_20 = (TaggedSignalVector)local_28;
  }
  std::unique_lock<QBasicMutex>::~unique_lock(in_stack_ffffffffffffff70);
  if ((iVar1 < 2) &&
     (uVar3 = TaggedSignalVector::operator_cast_to_unsigned_long(&local_20), uVar3 != 0)) {
    if (in_EDX == 1) {
      QBasicMutex::unlock(in_RDI);
      deleteOrphaned(in_stack_ffffffffffffff78);
      QBasicMutex::lock((QBasicMutex *)in_stack_ffffffffffffff70);
    }
    else {
      deleteOrphaned(in_stack_ffffffffffffff78);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QObjectPrivate::ConnectionData::cleanOrphanedConnectionsImpl(QObject *sender, LockPolicy lockPolicy)
{
    QBasicMutex *senderMutex = signalSlotLock(sender);
    TaggedSignalVector c = nullptr;
    {
        std::unique_lock<QBasicMutex> lock(*senderMutex, std::defer_lock_t{});
        if (lockPolicy == NeedToLock)
            lock.lock();
        if (ref.loadAcquire() > 1)
            return;

        // Since ref == 1, no activate() is in process since we locked the mutex. That implies,
        // that nothing can reference the orphaned connection objects anymore and they can
        // be safely deleted
        c = orphaned.exchange(nullptr, std::memory_order_relaxed);
    }
    if (c) {
        // Deleting c might run arbitrary user code, so we must not hold the lock
        if (lockPolicy == AlreadyLockedAndTemporarilyReleasingLock) {
            senderMutex->unlock();
            deleteOrphaned(c);
            senderMutex->lock();
        } else {
            deleteOrphaned(c);
        }
    }
}